

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O0

R_conflict7 * splitFrontMatter(QStringView md)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  bool bVar1;
  qsizetype qVar2;
  storage_type_conflict *in_RDX;
  qsizetype in_RSI;
  R_conflict7 *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar3;
  qsizetype endMarkerPos;
  qsizetype frontMatterStart;
  QStringView frontMatter;
  QLatin1StringView marker;
  R_conflict7 NotFound;
  undefined4 in_stack_ffffffffffffff18;
  CaseSensitivity in_stack_ffffffffffffff1c;
  QChar *in_stack_ffffffffffffff20;
  uint7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined1 uVar4;
  R_conflict7 *this;
  qsizetype in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  QLatin1StringView in_stack_ffffffffffffff50;
  qsizetype local_90;
  storage_type_conflict *local_88;
  QChar local_7c;
  char16_t local_7a;
  undefined1 *local_78;
  char *local_70;
  QLatin1StringView local_68;
  QLatin1StringView local_58;
  QLatin1String local_48;
  QStringView local_38;
  undefined1 *local_28;
  storage_type_conflict *local_20;
  qsizetype local_18;
  storage_type_conflict *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  local_18 = in_RSI;
  local_10 = in_RDX;
  QStringView::QStringView(&local_38);
  local_28 = (undefined1 *)local_18;
  local_20 = local_10;
  local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.m_data = &DAT_aaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(&local_48);
  lfMarkerString();
  s.m_data = in_stack_ffffffffffffff48;
  s.m_size = in_stack_ffffffffffffff40;
  bVar1 = QStringView::startsWith
                    ((QStringView *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),s,
                     CaseInsensitive);
  if (bVar1) {
    local_58 = lfMarkerString();
    local_48.m_size = local_58.m_size;
    local_48.m_data = local_58.m_data;
  }
  else {
    in_stack_ffffffffffffff50 = crlfMarkerString();
    s_00.m_data = in_stack_ffffffffffffff48;
    s_00.m_size = in_stack_ffffffffffffff40;
    bVar1 = QStringView::startsWith
                      ((QStringView *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       s_00,CaseInsensitive);
    if (!bVar1) {
      (this->frontMatter).m_size = local_38.m_size;
      (this->frontMatter).m_data = local_38.m_data;
      (this->rest).m_size = (qsizetype)local_28;
      (this->rest).m_data = local_20;
      goto LAB_009fd388;
    }
    local_68 = crlfMarkerString();
    local_48.m_size = local_68.m_size;
    local_48.m_data = local_68.m_data;
  }
  QLatin1String::size(&local_48);
  local_78 = (undefined1 *)local_48.m_size;
  local_70 = local_48.m_data;
  qVar2 = QStringView::indexOf
                    ((QStringView *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff50,(qsizetype)in_stack_ffffffffffffff20,
                     in_stack_ffffffffffffff1c);
  uVar4 = true;
  if (-1 < qVar2) {
    local_7a = (char16_t)
               QStringView::operator[]
                         ((QStringView *)CONCAT17(1,in_stack_ffffffffffffff28),
                          (qsizetype)in_stack_ffffffffffffff20);
    QChar::QChar<QChar::SpecialCharacter,_true>(&local_7c,LineFeed);
    uVar4 = operator!=(in_stack_ffffffffffffff20,
                       (QChar *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if ((bool)uVar4 == false) {
    QVar3 = QStringView::sliced(&this->frontMatter,(ulong)in_stack_ffffffffffffff28,
                                (qsizetype)in_stack_ffffffffffffff20);
    local_90 = QVar3.m_size;
    (this->frontMatter).m_size = local_90;
    local_88 = QVar3.m_data;
    (this->frontMatter).m_data = local_88;
    QLatin1String::size(&local_48);
    QVar3 = QStringView::sliced(&this->frontMatter,CONCAT17(uVar4,in_stack_ffffffffffffff28));
    this->rest = QVar3;
  }
  else {
    (this->frontMatter).m_size = local_38.m_size;
    (this->frontMatter).m_data = local_38.m_data;
    (this->rest).m_size = (qsizetype)local_28;
    (this->rest).m_data = local_20;
  }
LAB_009fd388:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static auto splitFrontMatter(QStringView md)
{
    struct R {
        QStringView frontMatter, rest;
        explicit operator bool() const noexcept { return !frontMatter.isEmpty(); }
    };

    const auto NotFound = R{{}, md};

    /*  Front Matter must start with '---\n' or '---\r\n' on the very first line,
        and Front Matter must end with another such line.
        If that is not the case, we return NotFound: then the whole document is
        to be passed on to the Markdown parser, in which '---\n' is interpreted
        as a "thematic break" (like <hr/> in HTML). */
    QLatin1StringView marker;
    if (md.startsWith(lfMarkerString()))
        marker = lfMarkerString();
    else if (md.startsWith(crlfMarkerString()))
        marker = crlfMarkerString();
    else
        return NotFound;

    const auto frontMatterStart = marker.size();
    const auto endMarkerPos = md.indexOf(marker, frontMatterStart);

    if (endMarkerPos < 0 || md[endMarkerPos - 1] != QChar::LineFeed)
        return NotFound;

    Q_ASSERT(frontMatterStart < md.size());
    Q_ASSERT(endMarkerPos < md.size());
    const auto frontMatter = md.sliced(frontMatterStart, endMarkerPos - frontMatterStart);
    return R{frontMatter, md.sliced(endMarkerPos + marker.size())};
}